

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

void LTACMasterdataChannel::RegisterMasterDataChn(LTACMasterdataChannel *pChn,bool bToFrontOfQueue)

{
  _List_iterator<LTACMasterdataChannel_*> _Var1;
  LTACMasterdataChannel *pChn_local;
  
  pChn_local = pChn;
  std::recursive_mutex::lock(&mtxMaster);
  _Var1 = std::
          __find_if<std::_List_iterator<LTACMasterdataChannel*>,__gnu_cxx::__ops::_Iter_equals_val<LTACMasterdataChannel*const>>
                    (lstChn_abi_cxx11_.
                     super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>
                     ._M_impl._M_node.super__List_node_base._M_next,&lstChn_abi_cxx11_,&pChn_local);
  if (_Var1._M_node == (_List_node_base *)&lstChn_abi_cxx11_) {
    if (bToFrontOfQueue) {
      std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::
      push_front(&lstChn_abi_cxx11_,&pChn_local);
    }
    else {
      std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::
      push_back(&lstChn_abi_cxx11_,&pChn_local);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
  return;
}

Assistant:

void LTACMasterdataChannel::RegisterMasterDataChn (LTACMasterdataChannel* pChn,
                                                   bool bToFrontOfQueue)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // just add the channel to the list of channels
        if (std::find(lstChn.begin(), lstChn.end(), pChn) == lstChn.end()) {
            if (bToFrontOfQueue)
                lstChn.push_front(pChn);
            else
                lstChn.push_back(pChn);
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}